

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redundancy_elimination.cpp
# Opt level: O2

Status __thiscall spvtools::opt::RedundancyEliminationPass::Process(RedundancyEliminationPass *this)

{
  Module *pMVar1;
  pointer puVar2;
  __uniq_ptr_data<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>,_true,_true>
  f;
  bool bVar3;
  DominatorTree *this_00;
  DominatorTreeNode *bb;
  pointer puVar4;
  byte bVar5;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  value_to_ids;
  ValueNumberTable vnTable;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  local_110;
  ValueNumberTable local_e0;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  local_60;
  
  ValueNumberTable::ValueNumberTable
            (&local_e0,(this->super_LocalRedundancyEliminationPass).super_Pass.context_);
  pMVar1 = (((this->super_LocalRedundancyEliminationPass).super_Pass.context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  puVar2 = *(pointer *)
            ((long)&(pMVar1->functions_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
            + 8);
  bVar5 = 0;
  for (puVar4 = *(pointer *)
                 &(pMVar1->functions_).
                  super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                  ._M_impl; puVar4 != puVar2; puVar4 = puVar4 + 1) {
    f.super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>.
    _M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
    .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl =
         (puVar4->_M_t).
         super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
    ;
    if (*(pointer *)
         &(((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             *)((long)f.
                      super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                      .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl + 0x98))
          ->
          super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
          )._M_impl !=
        *(pointer *)
         ((long)f.
                super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl + 0xa0)) {
      this_00 = (DominatorTree *)
                IRContext::GetDominatorAnalysis
                          ((this->super_LocalRedundancyEliminationPass).super_Pass.context_,
                           (Function *)
                           f.
                           super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                           .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl);
      local_110._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_110._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_110._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_110._M_impl.super__Rb_tree_header._M_header;
      local_110._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_110._M_impl.super__Rb_tree_header._M_header._M_right =
           local_110._M_impl.super__Rb_tree_header._M_header._M_left;
      bb = DominatorTree::GetRoot(this_00);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::_Rb_tree(&local_60,&local_110);
      bVar3 = EliminateRedundanciesFrom
                        (this,bb,&local_e0,
                         (map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                          *)&local_60);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::~_Rb_tree(&local_60);
      bVar5 = bVar5 | bVar3;
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::~_Rb_tree(&local_110);
    }
  }
  ValueNumberTable::~ValueNumberTable(&local_e0);
  return bVar5 ^ SuccessWithoutChange;
}

Assistant:

Pass::Status RedundancyEliminationPass::Process() {
  bool modified = false;
  ValueNumberTable vnTable(context());

  for (auto& func : *get_module()) {
    if (func.IsDeclaration()) {
      continue;
    }

    // Build the dominator tree for this function. It is how the code is
    // traversed.
    DominatorTree& dom_tree =
        context()->GetDominatorAnalysis(&func)->GetDomTree();

    // Keeps track of all ids that contain a given value number. We keep
    // track of multiple values because they could have the same value, but
    // different decorations.
    std::map<uint32_t, uint32_t> value_to_ids;

    if (EliminateRedundanciesFrom(dom_tree.GetRoot(), vnTable, value_to_ids)) {
      modified = true;
    }
  }
  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}